

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

bool __thiscall Character::DelItem(Character *this,short item,int amount)

{
  list<Character_Item,_std::allocator<Character_Item>_> *plVar1;
  size_t *psVar2;
  int iVar3;
  bool bVar4;
  _List_node_base *p_Var5;
  
  if (amount < 1) {
    bVar4 = false;
  }
  else {
    plVar1 = &this->inventory;
    p_Var5 = (_List_node_base *)plVar1;
    do {
      p_Var5 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var5->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      bVar4 = p_Var5 != (_List_node_base *)plVar1;
      if (p_Var5 == (_List_node_base *)plVar1) {
        return bVar4;
      }
    } while (*(short *)&p_Var5[1]._M_next != item);
    iVar3 = *(int *)((long)&p_Var5[1]._M_next + 4);
    if ((iVar3 < 0) || (iVar3 - amount == 0 || iVar3 < amount)) {
      psVar2 = &(this->inventory).super__List_base<Character_Item,_std::allocator<Character_Item>_>.
                _M_impl._M_node._M_size;
      *psVar2 = *psVar2 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5,0x18);
    }
    else {
      *(int *)((long)&p_Var5[1]._M_next + 4) = iVar3 - amount;
    }
    CalculateStats(this,true);
  }
  return bVar4;
}

Assistant:

bool Character::DelItem(short item, int amount)
{
	if (amount <= 0)
	{
		return false;
	}

	UTIL_IFOREACH(this->inventory, it)
	{
		if (it->id == item)
		{
			if (it->amount < 0 || it->amount - amount <= 0)
			{
				this->inventory.erase(it);
			}
			else
			{
				it->amount -= amount;
			}

			this->CalculateStats();

			return true;
		}
	}

	return false;
}